

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O1

Option * __thiscall
CLI::App::add_flag_callback
          (App *this,string *flag_name,function<void_()> *function,string *flag_description)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  Option *pOVar3;
  callback_t fun;
  _Any_data local_c8;
  code *local_b8;
  code *pcStack_b0;
  _Any_data local_a8;
  code *local_98;
  code *local_90;
  string local_80;
  _Any_data local_60;
  code *local_50;
  undefined8 uStack_48;
  string local_40;
  
  std::function<void_()>::function((function<void_()> *)&local_60,function);
  local_b8 = (code *)0x0;
  pcStack_b0 = (code *)0x0;
  local_c8._M_unused._M_object = (void *)0x0;
  local_c8._8_8_ = 0;
  local_c8._M_unused._M_object = operator_new(0x20);
  *(undefined8 *)local_c8._M_unused._0_8_ = 0;
  *(undefined8 *)((long)local_c8._M_unused._0_8_ + 8) = 0;
  *(undefined8 *)((long)local_c8._M_unused._0_8_ + 0x10) = 0;
  *(undefined8 *)((long)local_c8._M_unused._0_8_ + 0x18) = uStack_48;
  if (local_50 != (code *)0x0) {
    *(void **)local_c8._M_unused._0_8_ = local_60._M_unused._M_object;
    *(undefined8 *)((long)local_c8._M_unused._0_8_ + 8) = local_60._8_8_;
    *(code **)((long)local_c8._M_unused._0_8_ + 0x10) = local_50;
    local_50 = (code *)0x0;
    uStack_48 = 0;
  }
  pcStack_b0 = std::
               _Function_handler<bool_(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/ThirdParty/CLI11.hpp:8429:27)>
               ::_M_invoke;
  local_b8 = std::
             _Function_handler<bool_(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/ThirdParty/CLI11.hpp:8429:27)>
             ::_M_manager;
  if (local_50 != (code *)0x0) {
    (*local_50)(&local_60,&local_60,__destroy_functor);
  }
  pcVar2 = (flag_name->_M_dataplus)._M_p;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar2,pcVar2 + flag_name->_M_string_length);
  local_a8._M_unused._M_object = (_func_void *)0x0;
  local_a8._8_8_ = 0;
  local_98 = (code *)0x0;
  local_90 = pcStack_b0;
  if (local_b8 != (code *)0x0) {
    local_a8._M_unused._M_function_pointer = (_func_void *)local_c8._M_unused._0_8_;
    local_a8._8_8_ = local_c8._8_8_;
    local_98 = local_b8;
    local_b8 = (code *)0x0;
    pcStack_b0 = (code *)0x0;
  }
  local_80._M_dataplus._M_p = (flag_description->_M_dataplus)._M_p;
  paVar1 = &flag_description->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p == paVar1) {
    local_80.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_80.field_2._8_8_ = *(undefined8 *)((long)&flag_description->field_2 + 8);
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  }
  else {
    local_80.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_80._M_string_length = flag_description->_M_string_length;
  (flag_description->_M_dataplus)._M_p = (pointer)paVar1;
  flag_description->_M_string_length = 0;
  (flag_description->field_2)._M_local_buf[0] = '\0';
  pOVar3 = _add_flag_internal(this,&local_40,(callback_t *)&local_a8,&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  if (local_98 != (code *)0x0) {
    (*local_98)(&local_a8,&local_a8,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  if (local_b8 != (code *)0x0) {
    (*local_b8)(&local_c8,&local_c8,__destroy_functor);
  }
  return pOVar3;
}

Assistant:

CLI11_INLINE Option *App::add_flag_callback(std::string flag_name,
                                            std::function<void(void)> function,  ///< A function to call, void(void)
                                            std::string flag_description) {

    CLI::callback_t fun = [function](const CLI::results_t &res) {
        using CLI::detail::lexical_cast;
        bool trigger{false};
        auto result = lexical_cast(res[0], trigger);
        if(result && trigger) {
            function();
        }
        return result;
    };
    return _add_flag_internal(flag_name, std::move(fun), std::move(flag_description));
}